

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O1

int __thiscall Annotations::Load(Annotations *this)

{
  pointer pcVar1;
  FILE *__stream;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  string sqlfn;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (this->filename)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (this->filename)._M_string_length);
  lVar3 = std::__cxx11::string::rfind((char)local_38,0x2e);
  if (lVar3 != -1) {
    *(undefined1 *)((long)local_38[0] + lVar3) = 0x5f;
  }
  std::__cxx11::string::append((char *)local_38);
  this->sqldb = (sqlite3 *)0x0;
  iVar2 = sqlite3_open(local_38[0],&this->sqldb);
  __stream = _stderr;
  if (iVar2 == 0) {
    if (this->debug == true) {
      Load();
    }
    Init(this);
    GenerateList(this);
  }
  else {
    uVar4 = sqlite3_errmsg(this->sqldb);
    fprintf(__stream,"Can\'t open database: %s\n",uVar4);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return 0;
}

Assistant:

int Annotations::Load(void) {
	std::string sqlfn                        = filename;
	auto pos                                 = sqlfn.rfind('.');
	if (pos != std::string::npos) sqlfn[pos] = '_';
	sqlfn += ".sqlite3";

	sqldb = nullptr;
	int r = sqlite3_open(sqlfn.c_str(), &sqldb);
	if (r) {
		fprintf(stderr, "Can't open database: %s\n", sqlite3_errmsg(sqldb));
	} else {
		if (debug) fprintf(stderr, "Opened database successfully\n");
		Init();
		GenerateList();
	}
	return 0;
}